

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Coxeter_triangulation.h
# Opt level: O3

Matrix * __thiscall
Gudhi::coxeter_triangulation::
Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
::root_matrix(Matrix *__return_storage_ptr__,
             Coxeter_triangulation<Gudhi::coxeter_triangulation::Permutahedral_representation<std::vector<int,_std::allocator<int>_>,_std::vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>_>
             *this,uint d)

{
  double *pdVar1;
  void *pvVar2;
  EigenvectorsType *pEVar3;
  undefined8 *puVar4;
  char *__function;
  ulong uVar5;
  double *pdVar6;
  double *pdVar7;
  double dVar8;
  VectorXd sqrt_diag;
  Matrix lower;
  Matrix cartan;
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> saes;
  assign_op<double,_double> local_d9;
  void *local_d8;
  double *pdStack_d0;
  DenseStorage<double,__1,__1,__1,_0> local_c8;
  Matrix<double,__1,__1,_0,__1,__1> local_a8;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
  local_90;
  SelfAdjointEigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_78;
  
  pdVar7 = (double *)(ulong)d;
  local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
  local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
  local_78.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data
       = pdVar7;
  local_78.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows
       = (Index)pdVar7;
  Eigen::internal::
  call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>,Eigen::internal::assign_op<double,double>>
            (&local_a8,
             (CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
              *)&local_78,(assign_op<double,_double> *)&local_c8);
  if (1 < d) {
    pdVar1 = local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_data + 1;
    uVar5 = 1;
    do {
      if ((((local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
             m_rows < (long)uVar5) ||
           (local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
            m_cols <= (long)uVar5)) ||
          (pdVar1[local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                  m_storage.m_rows - 1] = -0.5,
          (ulong)local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_rows <= uVar5)) ||
         ((ulong)local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage
                 .m_cols <= uVar5 - 1)) {
        __assert_fail("row >= 0 && row < rows() && col >= 0 && col < cols()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x16f,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, -1>, 1>::operator()(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>, Level = 1]"
                     );
      }
      *pdVar1 = -0.5;
      pdVar1 = pdVar1 + local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                        m_storage.m_rows + 1;
      uVar5 = uVar5 + 1;
    } while ((double *)uVar5 != pdVar7);
  }
  Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((SelfAdjointEigenSolver<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_78,
             (EigenBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)&local_a8,0x80);
  local_d8 = (void *)0x0;
  pdStack_d0 = (double *)0x0;
  pdVar1 = pdVar7;
  if (d != 0) {
    pvVar2 = malloc((long)pdVar7 * 8);
    if ((d != 1) && (((ulong)pvVar2 & 0xf) != 0)) {
      __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                    ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                    "void *Eigen::internal::aligned_malloc(std::size_t)");
    }
    if (pvVar2 == (void *)0x0) {
      puVar4 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar4 = operator_delete;
      __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    pdVar6 = (double *)0x0;
    local_d8 = pvVar2;
    pdStack_d0 = pdVar7;
    do {
      if (local_78.m_isInitialized == false) {
        __assert_fail("m_isInitialized && \"SelfAdjointEigenSolver is not initialized.\"",
                      "/usr/include/eigen3/Eigen/src/Eigenvalues/SelfAdjointEigenSolver.h",0x12e,
                      "const RealVectorType &Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double, -1, -1>>::eigenvalues() const [_MatrixType = Eigen::Matrix<double, -1, -1>]"
                     );
      }
      if (local_78.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows <= (long)pdVar6) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xa3,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      dVar8 = local_78.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_data[(long)pdVar6];
      if (dVar8 < 0.0) {
        dVar8 = sqrt(dVar8);
      }
      else {
        dVar8 = SQRT(dVar8);
      }
      if (pdVar7 <= pdVar6) {
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      *(double *)((long)pvVar2 + (long)pdVar6 * 8) = dVar8;
      pdVar6 = (double *)((long)pdVar6 + 1);
      pdVar1 = pdStack_d0;
    } while (pdVar7 != pdVar6);
  }
  pdStack_d0 = pdVar1;
  local_90.m_functor.m_other = 1.0;
  local_c8.m_data = (double *)0x0;
  local_c8.m_rows = 0;
  local_c8.m_cols = 0;
  local_90.m_rows.m_value = (long)pdVar7;
  local_90.m_cols.m_value = (long)pdVar7;
  Eigen::internal::call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_c8,&local_90,&local_d9);
  local_90.m_rows.m_value = (long)&local_c8;
  if ((local_c8.m_cols != 0 && (double *)local_c8.m_rows != (double *)0x0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(local_c8.m_cols),0) <
      local_c8.m_rows)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = operator_delete;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  if ((local_c8.m_cols | local_c8.m_rows) < 0) {
    __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                  ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, -1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, -1>]"
                 );
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
            (&local_c8,local_c8.m_cols * local_c8.m_rows,local_c8.m_rows,local_c8.m_cols);
  Eigen::internal::
  call_triangular_assignment_loop<1,true,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::TriangularView<Eigen::Matrix<double,_1,_1,0,_1,_1>,1u>,Eigen::internal::assign_op<double,double>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)&local_c8,
             (TriangularView<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1U> *)&local_90,&local_d9);
  pEVar3 = Eigen::SelfAdjointEigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::eigenvectors
                     (&local_78);
  if (local_c8.m_cols ==
      (pEVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows) {
    pdVar7 = (double *)
             (pEVar3->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_cols;
    if (pdVar7 == pdStack_d0) {
      if ((double *)local_c8.m_rows != pdVar7) {
        __assert_fail("rows() == cols()","/usr/include/eigen3/Eigen/src/LU/InverseImpl.h",0x15f,
                      "const Inverse<Derived> Eigen::MatrixBase<Eigen::Product<Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, 1>>::inverse() const [Derived = Eigen::Product<Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, 1>]"
                     );
      }
      local_90.m_functor.m_other = (double)&local_d8;
      local_90.m_rows.m_value = (long)&local_c8;
      local_90.m_cols.m_value = (long)pEVar3;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Inverse<Eigen::Product<Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,0>,Eigen::DiagonalWrapper<Eigen::Matrix<double,_1,1,0,_1,1>const>,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
                 (DenseBase<Eigen::Inverse<Eigen::Product<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_0>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_1>_>_>
                  *)&local_90);
      free(local_c8.m_data);
      free(local_d8);
      free(local_78.m_hcoeffs.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_78.m_subdiag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_78.m_eivalues.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data);
      free(local_78.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_a8.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      return __return_storage_ptr__;
    }
    __function = 
    "Eigen::Product<Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, 1>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>, Rhs = Eigen::DiagonalWrapper<const Eigen::Matrix<double, -1, 1>>, Option = 1]"
    ;
  }
  else {
    __function = 
    "Eigen::Product<Eigen::Matrix<double, -1, -1>, Eigen::Matrix<double, -1, -1>>::Product(const Lhs &, const Rhs &) [Lhs = Eigen::Matrix<double, -1, -1>, Rhs = Eigen::Matrix<double, -1, -1>, Option = 0]"
    ;
  }
  __assert_fail("lhs.cols() == rhs.rows() && \"invalid matrix product\" && \"if you wanted a coeff-wise or a dot product use the respective explicit functions\""
                ,"/usr/include/eigen3/Eigen/src/Core/Product.h",0x62,__function);
}

Assistant:

Matrix root_matrix(unsigned d) {
    Matrix cartan(Matrix::Identity(d, d));
    for (unsigned i = 1; i < d; i++) {
      cartan(i - 1, i) = -0.5;
      cartan(i, i - 1) = -0.5;
    }
    Eigen::SelfAdjointEigenSolver<Matrix> saes(cartan);
    Eigen::VectorXd sqrt_diag(d);
    for (unsigned i = 0; i < d; ++i) sqrt_diag(i) = std::sqrt(saes.eigenvalues()[i]);

    Matrix lower(Matrix::Ones(d, d));
    lower = lower.triangularView<Eigen::Lower>();

    Matrix result = (lower * saes.eigenvectors() * sqrt_diag.asDiagonal()).inverse();
    return result;
  }